

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TextureWrapCase::TextureWrapCase
          (TextureWrapCase *this,TestContext *testCtx,RenderContext *renderCtx,ContextInfo *ctxInfo,
          char *name,char *description,deUint32 format,deUint32 dataType,deUint32 wrapS,
          deUint32 wrapT,deUint32 minFilter,deUint32 magFilter,int width,int height)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureWrapCase_02121bb0;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = ctxInfo;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_width = width;
  this->m_height = height;
  (this->m_filenames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filenames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filenames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_texture = (Texture2D *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,testCtx->m_log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  return;
}

Assistant:

TextureWrapCase::TextureWrapCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const glu::ContextInfo& ctxInfo, const char* name, const char* description, deUint32 format, deUint32 dataType, deUint32 wrapS, deUint32 wrapT, deUint32 minFilter, deUint32 magFilter, int width, int height)
	: TestCase			(testCtx, name, description)
	, m_renderCtx		(renderCtx)
	, m_renderCtxInfo	(ctxInfo)
	, m_format			(format)
	, m_dataType		(dataType)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_width			(width)
	, m_height			(height)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP)
{
}